

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O0

MemoryWriter * spdlog::details::pad_n_join(MemoryWriter *w,int v1,int v2,char sep)

{
  BasicWriter<char> *pBVar1;
  IntFormatSpec<int,_fmt::AlignTypeSpec<__x00_>,_char> IVar2;
  char sep_local;
  int v2_local;
  int v1_local;
  MemoryWriter *w_local;
  
  IVar2 = fmt::pad<char>(v1,2,'0');
  pBVar1 = fmt::BasicWriter<char>::operator<<(&w->super_BasicWriter<char>,IVar2);
  pBVar1 = fmt::BasicWriter<char>::operator<<(pBVar1,sep);
  IVar2 = fmt::pad<char>(v2,2,'0');
  fmt::BasicWriter<char>::operator<<(pBVar1,IVar2);
  return w;
}

Assistant:

static fmt::MemoryWriter &pad_n_join(fmt::MemoryWriter &w, int v1, int v2, char sep)
{
    w << fmt::pad(v1, 2, '0') << sep << fmt::pad(v2, 2, '0');
    return w;
}